

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

void SetupHelpOptions(ArgsManager *args)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  OptionsCategory *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe98;
  allocator_type *in_stack_fffffffffffffec0;
  undefined1 *puVar2;
  allocator<char> *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  ArgsManager *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  uint flags;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  string *in_stack_ffffffffffffff20;
  ArgsManager *in_stack_ffffffffffffff28;
  undefined1 local_ab [2];
  allocator<char> local_a9 [31];
  allocator<char> local_8a;
  allocator<char> local_89;
  undefined1 local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  flags = (uint)((ulong)&local_89 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_a9[0x19] = (allocator<char>)0x0;
  local_a9[0x1a] = (allocator<char>)0x0;
  local_a9[0x1b] = (allocator<char>)0x0;
  local_a9[0x1c] = (allocator<char>)0x0;
  ArgsManager::AddArg(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                      (string *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),flags,
                      in_RDI);
  std::__cxx11::string::~string(in_stack_fffffffffffffe88);
  std::allocator<char>::~allocator(&local_8a);
  std::__cxx11::string::~string(in_stack_fffffffffffffe88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  this_00 = &local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  this = (ArgsManager *)local_ab;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffe88);
  __l._M_len = (size_type)this_00;
  __l._M_array = (iterator)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffec8,__l,in_stack_fffffffffffffec0);
  ArgsManager::AddHiddenArgs
            (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffec8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffe98);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffe88);
  puVar2 = local_88;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x20;
    std::__cxx11::string::~string(in_stack_fffffffffffffe88);
  } while (puVar1 != puVar2);
  std::allocator<char>::~allocator((allocator<char> *)(local_ab + 1));
  std::allocator<char>::~allocator(local_a9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetupHelpOptions(ArgsManager& args)
{
    args.AddArg("-?", "Print this help message and exit", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    args.AddHiddenArgs({"-h", "-help"});
}